

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

uint64_t phosg::start_time_for_pid(pid_t pid,bool allow_zombie)

{
  bool bVar1;
  uint64_t uVar2;
  stat st;
  stat sStack_c8;
  
  string_printf_abi_cxx11_((string *)&sStack_c8,"/proc/%d",pid);
  stat((char *)&sStack_c8.st_gid,&sStack_c8);
  ::std::__cxx11::string::~string((string *)&sStack_c8);
  uVar2 = sStack_c8.__unused[0] * 1000000000 + sStack_c8.__unused[1];
  if (!allow_zombie) {
    bVar1 = pid_is_zombie(pid);
    if (bVar1) {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint64_t start_time_for_pid(pid_t pid, bool allow_zombie) {
#ifdef PHOSG_MACOS
  (void)allow_zombie;

  struct proc_taskallinfo ti;
  int ret = proc_pidinfo(pid, PROC_PIDTASKALLINFO, 0, &ti, sizeof(ti));
  if (ret <= 0) {
    if (errno == ESRCH) {
      return 0;
    }
    throw runtime_error("can\'t get start time for pid " + to_string(pid) +
        ": " + string_for_error(errno));
  }
  if (static_cast<size_t>(ret) < sizeof(ti)) {
    throw runtime_error("can\'t get start time for pid " + to_string(pid) +
        ": " + string_for_error(errno));
  }

  return (uint64_t)ti.pbsd.pbi_start_tvsec * 1000000 +
      (uint64_t)ti.pbsd.pbi_start_tvusec;

#else
  uint64_t start_time;
  try {
    struct stat st = stat(string_printf("/proc/%d", pid));
    start_time = (uint64_t)st.st_mtim.tv_sec * 1000000000 +
        (uint64_t)st.st_mtim.tv_nsec;
  } catch (const cannot_stat_file& e) {
    return 0;
  }

  if (!allow_zombie && pid_is_zombie(pid)) {
    return 0;
  }
  return start_time;
#endif
}